

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildDouble1Long1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  RegOpnd *this_00;
  undefined4 *puVar3;
  Instr *instr_00;
  Instr *instr;
  RegOpnd *dstOpnd;
  RegOpnd *pRStack_28;
  OpCode op;
  RegOpnd *srcOpnd;
  RegSlot srcRegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  pRStack_28 = (RegOpnd *)0x0;
  dstOpnd._6_2_ = Conv_Prim;
  this_00 = BuildDstOpnd(this,dstRegSlot,TyFloat64);
  IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Float);
  if (newOpcode == Reinterpret_LTD) {
    pRStack_28 = BuildSrcOpnd(this,srcRegSlot,TyInt64);
    dstOpnd._6_2_ = Reinterpret_Prim;
  }
  else if (newOpcode == Conv_LTD) {
    pRStack_28 = BuildSrcOpnd(this,srcRegSlot,TyInt64);
  }
  else if (newOpcode == Conv_ULTD) {
    pRStack_28 = BuildSrcOpnd(this,srcRegSlot,TyUint64);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xdad,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr();
    *puVar3 = 0;
  }
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&pRStack_28->super_Opnd,valueType);
  instr_00 = IR::Instr::New(dstOpnd._6_2_,&this_00->super_Opnd,&pRStack_28->super_Opnd,this->m_func)
  ;
  AddInstr(this,instr_00,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildDouble1Long1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = nullptr;
    Js::OpCode op = Js::OpCode::Conv_Prim;

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat64);
    dstOpnd->SetValueType(ValueType::Float);
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Conv_LTD:
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt64);
        break;
    case Js::OpCodeAsmJs::Conv_ULTD:
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyUint64);
        break;
    case Js::OpCodeAsmJs::Reinterpret_LTD:
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt64);
        op = Js::OpCode::Reinterpret_Prim;
        break;
    default:
        Assume(UNREACHED);
    }
    srcOpnd->SetValueType(ValueType::GetInt(false));
    IR::Instr* instr = IR::Instr::New(op, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}